

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O2

UnaryOp wasm::Abstract::getUnary(Type type,Op op)

{
  BasicType BVar1;
  UnaryOp UVar2;
  UnaryOp UVar3;
  bool bVar4;
  Type local_18;
  Type type_local;
  
  local_18.id = type.id;
  BVar1 = wasm::Type::getBasic(&local_18);
  UVar2 = InvalidUnary;
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    goto switchD_008ef217_caseD_0;
  case i32:
    UVar3 = InvalidUnary;
    if (op == Popcnt) {
      UVar3 = PopcntInt32;
    }
    bVar4 = op == EqZ;
    UVar2 = EqZInt32;
    break;
  case i64:
    UVar3 = InvalidUnary;
    if (op == Popcnt) {
      UVar3 = PopcntInt64;
    }
    bVar4 = op == EqZ;
    UVar2 = EqZInt64;
    break;
  case f32:
    UVar3 = InvalidUnary;
    if (op == Neg) {
      UVar3 = NegFloat32;
    }
    bVar4 = op == Abs;
    UVar2 = AbsFloat32;
    break;
  case f64:
    UVar3 = InvalidUnary;
    if (op == Neg) {
      UVar3 = NegFloat64;
    }
    bVar4 = op == Abs;
    UVar2 = AbsFloat64;
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/abstract.h"
                       ,0x85);
  }
  if (!bVar4) {
    UVar2 = UVar3;
  }
switchD_008ef217_caseD_0:
  return UVar2;
}

Assistant:

inline UnaryOp getUnary(Type type, Op op) {
  switch (type.getBasic()) {
    case Type::i32: {
      switch (op) {
        case EqZ:
          return EqZInt32;
        case Popcnt:
          return PopcntInt32;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::i64: {
      switch (op) {
        case EqZ:
          return EqZInt64;
        case Popcnt:
          return PopcntInt64;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::f32: {
      switch (op) {
        case Abs:
          return AbsFloat32;
        case Neg:
          return NegFloat32;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::f64: {
      switch (op) {
        case Abs:
          return AbsFloat64;
        case Neg:
          return NegFloat64;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::v128:
    case Type::none:
    case Type::unreachable: {
      return InvalidUnary;
    }
  }
  WASM_UNREACHABLE("invalid type");
}